

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O2

Matrix<float> __thiscall gnns::load_from_file<float>(gnns *this,string *file_name)

{
  ostream *poVar1;
  FILE *__stream;
  ulong uVar2;
  void *__ptr;
  GnnsException *pGVar3;
  float *extraout_RDX;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  Matrix<float> MVar7;
  allocator local_ad;
  int local_ac;
  ulong local_a8;
  void *local_a0;
  gnns *local_98;
  int dim_;
  int dim;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"load_from_file ");
  poVar1 = std::operator<<(poVar1,(string *)file_name);
  std::endl<char,std::char_traits<char>>(poVar1);
  __stream = fopen((file_name->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    pGVar3 = (GnnsException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_50,"File ",&local_ad);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dim_,
                   &local_50,file_name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dim,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dim_,
                   "is NOT exist!\n");
    GnnsException::GnnsException(pGVar3,(string *)&dim);
    __cxa_throw(pGVar3,&GnnsException::typeinfo,std::runtime_error::~runtime_error);
  }
  local_98 = this;
  fread(&dim,4,1,__stream);
  uVar5 = 0;
  fseek(__stream,0,2);
  uVar2 = ftell(__stream);
  uVar2 = (long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
          (long)(dim * 4 + 4);
  local_ac = (int)uVar2;
  uVar4 = 0xffffffffffffffff;
  if (-1 < local_ac * dim) {
    uVar4 = (long)(local_ac * dim) * 4;
  }
  __ptr = operator_new__(uVar4);
  local_a8 = (ulong)(uint)dim;
  fseek(__stream,0,0);
  if (0 < local_ac) {
    uVar5 = uVar2 & 0xffffffff;
  }
  local_a0 = __ptr;
  while( true ) {
    bVar6 = uVar5 == 0;
    uVar5 = uVar5 - 1;
    if (bVar6) {
      fclose(__stream);
      *(int *)local_98 = (int)local_a8;
      *(int *)(local_98 + 4) = local_ac;
      *(void **)(local_98 + 8) = local_a0;
      MVar7.data = extraout_RDX;
      MVar7._0_8_ = local_98;
      return MVar7;
    }
    fread(&dim_,4,1,__stream);
    if (dim_ != (int)local_a8) break;
    fread(__ptr,4,(long)dim,__stream);
    __ptr = (void *)((long)__ptr + (long)dim * 4);
  }
  pGVar3 = (GnnsException *)__cxa_allocate_exception(0x10);
  GnnsException::GnnsException(pGVar3,"The dimensions of all rows are NOT same!\n");
  __cxa_throw(pGVar3,&GnnsException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Matrix<T> load_from_file(const std::string& file_name)
    {
        std::cout << "load_from_file " << file_name << std::endl;

        FILE *fp = fopen(file_name.c_str(), "rb");

        if (fp == NULL)
        {
            throw GnnsException(std::string("File ") + file_name + "is NOT exist!\n");
        }

        //read the vector dimension
        int dim;
        fread(&dim, 4, 1, fp);

        int col_size = 1 * 4 + sizeof(T) * dim;
        fseek(fp, 0, SEEK_END);
        int col = int(ftell(fp)) / col_size;

        //allocate memory for the vectors
        try {
            T* vecs = new T[dim * col];
            fseek(fp, 0, SEEK_SET);
            for (int i = 0; i < col; ++i)
            {
                int dim_;
                fread(&dim_, 4, 1, fp);
                if (dim_ != dim)
                {
                    throw GnnsException("The dimensions of all rows are NOT same!\n");
                }
                fread(vecs + i * dim, sizeof(T), dim, fp);
            }
            fclose(fp);

            return Matrix<T>(vecs, col, dim);
        } catch (const std::bad_alloc &ba) {
            throw ba;
        }
    }